

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O1

bool __thiscall Node::Stat(Node *this,DiskInterface *disk_interface,string *err)

{
  Metrics *this_00;
  int iVar1;
  long lVar2;
  Metric *pMVar3;
  ScopedMetric metrics_h_scoped;
  string local_60;
  ScopedMetric local_40;
  
  if ((Stat(DiskInterface*,std::__cxx11::string*)::metrics_h_metric == '\0') &&
     (iVar1 = __cxa_guard_acquire(&Stat(DiskInterface*,std::__cxx11::string*)::metrics_h_metric),
     this_00 = g_metrics, iVar1 != 0)) {
    if (g_metrics == (Metrics *)0x0) {
      pMVar3 = (Metric *)0x0;
    }
    else {
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"node stat","");
      pMVar3 = Metrics::NewMetric(this_00,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
    }
    Stat::metrics_h_metric = pMVar3;
    __cxa_guard_release(&Stat(DiskInterface*,std::__cxx11::string*)::metrics_h_metric);
  }
  ScopedMetric::ScopedMetric(&local_40,Stat::metrics_h_metric);
  lVar2 = (**(code **)(*(long *)disk_interface + 0x18))(disk_interface,this,err);
  this->mtime_ = lVar2;
  if (lVar2 != -1) {
    this->exists_ = ExistenceStatusExists - (lVar2 == 0);
  }
  ScopedMetric::~ScopedMetric(&local_40);
  return lVar2 != -1;
}

Assistant:

bool Node::Stat(DiskInterface* disk_interface, string* err) {
  METRIC_RECORD("node stat");
  mtime_ = disk_interface->Stat(path_, err);
  if (mtime_ == -1) {
    return false;
  }
  exists_ = (mtime_ != 0) ? ExistenceStatusExists : ExistenceStatusMissing;
  return true;
}